

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

DecodeStatus DecodePairLdStInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  
  uVar4 = insn >> 5 & 0x1f;
  uVar1 = MCInst_getOpcode(Inst);
  if (((uVar1 - 0x3b3 < 0x11) && ((0x1b6dbU >> (uVar1 - 0x3b3 & 0x1f) & 1) != 0)) ||
     ((uVar1 - 0x747 < 0xe && ((0x36dbU >> (uVar1 - 0x747 & 0x1f) & 1) != 0)))) {
    uVar3 = 4;
    if (uVar4 != 0x1f) {
      uVar3 = GPR64DecoderTable[uVar4];
    }
    MCOperand_CreateReg0(Inst,uVar3);
  }
  DVar2 = MCDisassembler_Fail;
  puVar5 = GPR64DecoderTable;
  switch(uVar1) {
  case 0x3ad:
  case 0x3b2:
  case 0x3b3:
  case 0x3b4:
switchD_00165e3f_caseD_3ad:
    puVar5 = FPR64DecoderTable;
    goto LAB_00165e8e;
  case 0x3ae:
  case 0x3b5:
  case 0x3b6:
  case 0x3b7:
switchD_00165e3f_caseD_3ae:
    puVar5 = FPR128DecoderTable;
    goto LAB_00165e8e;
  case 0x3af:
  case 0x3bb:
  case 0x3bc:
  case 0x3bd:
switchD_00165e3f_caseD_3af:
    puVar5 = FPR32DecoderTable;
    goto LAB_00165e8e;
  case 0x3b0:
  case 0x3be:
switchD_00165e3f_caseD_3b0:
    puVar5 = GPR32DecoderTable;
LAB_00165e8e:
    DVar2 = MCDisassembler_Fail;
    break;
  case 0x3b1:
  case 0x3b8:
  case 0x3c1:
    break;
  case 0x3b9:
  case 0x3ba:
  case 0x3c2:
  case 0x3c3:
switchD_00165e3f_caseD_3b9:
    DVar2 = MCDisassembler_SoftFail;
    puVar5 = GPR64DecoderTable;
    break;
  case 0x3bf:
  case 0x3c0:
switchD_00165e3f_caseD_3bf:
    DVar2 = MCDisassembler_SoftFail;
    puVar5 = GPR32DecoderTable;
    break;
  default:
    puVar5 = GPR64DecoderTable;
    switch(uVar1) {
    case 0x741:
    case 0x746:
    case 0x747:
    case 0x748:
      goto switchD_00165e3f_caseD_3ad;
    case 0x742:
    case 0x749:
    case 0x74a:
    case 0x74b:
      goto switchD_00165e3f_caseD_3ae;
    case 0x743:
    case 0x74c:
    case 0x74d:
    case 0x74e:
      goto switchD_00165e3f_caseD_3af;
    case 0x744:
    case 0x74f:
      goto switchD_00165e3f_caseD_3b0;
    case 0x745:
    case 0x752:
      break;
    case 0x750:
    case 0x751:
      goto switchD_00165e3f_caseD_3bf;
    case 0x753:
    case 0x754:
      goto switchD_00165e3f_caseD_3b9;
    default:
      goto switchD_00165e63_default;
    }
  }
  uVar3 = insn & 0x1f;
  uVar6 = insn >> 10 & 0x1f;
  MCOperand_CreateReg0(Inst,puVar5[uVar3]);
  MCOperand_CreateReg0(Inst,puVar5[uVar6]);
  uVar1 = 4;
  if (uVar4 != 0x1f) {
    uVar1 = GPR64DecoderTable[uVar4];
  }
  MCOperand_CreateReg0(Inst,uVar1);
  MCOperand_CreateImm0
            (Inst,(long)(int)((int)(insn << 10) >> 0x1f & 0xffffff80U | insn >> 0xf & 0x7f));
  if (((byte)(insn >> 0x16) & uVar3 == uVar6) == 0) {
    if (((char)DVar2 != '\x01' || uVar4 == 0x1f) ||
       (DVar2 = MCDisassembler_SoftFail, uVar6 != uVar4 && uVar3 != uVar4)) {
      DVar2 = MCDisassembler_Success;
    }
  }
  else {
    DVar2 = MCDisassembler_SoftFail;
  }
switchD_00165e63_default:
  return DVar2;
}

Assistant:

static DecodeStatus DecodePairLdStInstruction(MCInst *Inst, uint32_t insn,
		uint64_t Addr,
		void *Decoder)
{
	unsigned Rt = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Rt2 = fieldFromInstruction(insn, 10, 5);
	int32_t offset = fieldFromInstruction(insn, 15, 7);
	bool IsLoad = fieldFromInstruction(insn, 22, 1);
	unsigned Opcode = MCInst_getOpcode(Inst);
	bool NeedsDisjointWritebackTransfer = false;

	// offset is a 7-bit signed immediate, so sign extend it to
	// fill the unsigned.
	if (offset & (1 << (7 - 1)))
		offset |= ~((1LL << 7) - 1);

	// First operand is always writeback of base register.
	switch (Opcode) {
		default:
			break;
		case AArch64_LDPXpost:
		case AArch64_STPXpost:
		case AArch64_LDPSWpost:
		case AArch64_LDPXpre:
		case AArch64_STPXpre:
		case AArch64_LDPSWpre:
		case AArch64_LDPWpost:
		case AArch64_STPWpost:
		case AArch64_LDPWpre:
		case AArch64_STPWpre:
		case AArch64_LDPQpost:
		case AArch64_STPQpost:
		case AArch64_LDPQpre:
		case AArch64_STPQpre:
		case AArch64_LDPDpost:
		case AArch64_STPDpost:
		case AArch64_LDPDpre:
		case AArch64_STPDpre:
		case AArch64_LDPSpost:
		case AArch64_STPSpost:
		case AArch64_LDPSpre:
		case AArch64_STPSpre:
			DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
			break;
	}

	switch (Opcode) {
		default:
			return Fail;
		case AArch64_LDPXpost:
		case AArch64_STPXpost:
		case AArch64_LDPSWpost:
		case AArch64_LDPXpre:
		case AArch64_STPXpre:
		case AArch64_LDPSWpre:
			NeedsDisjointWritebackTransfer = true;
			// Fallthrough
		case AArch64_LDNPXi:
		case AArch64_STNPXi:
		case AArch64_LDPXi:
		case AArch64_STPXi:
		case AArch64_LDPSWi:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR64RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_LDPWpost:
		case AArch64_STPWpost:
		case AArch64_LDPWpre:
		case AArch64_STPWpre:
			NeedsDisjointWritebackTransfer = true;
			// Fallthrough
		case AArch64_LDNPWi:
		case AArch64_STNPWi:
		case AArch64_LDPWi:
		case AArch64_STPWi:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR32RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_LDNPQi:
		case AArch64_STNPQi:
		case AArch64_LDPQpost:
		case AArch64_STPQpost:
		case AArch64_LDPQi:
		case AArch64_STPQi:
		case AArch64_LDPQpre:
		case AArch64_STPQpre:
			DecodeFPR128RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeFPR128RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_LDNPDi:
		case AArch64_STNPDi:
		case AArch64_LDPDpost:
		case AArch64_STPDpost:
		case AArch64_LDPDi:
		case AArch64_STPDi:
		case AArch64_LDPDpre:
		case AArch64_STPDpre:
			DecodeFPR64RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeFPR64RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_LDNPSi:
		case AArch64_STNPSi:
		case AArch64_LDPSpost:
		case AArch64_STPSpost:
		case AArch64_LDPSi:
		case AArch64_STPSi:
		case AArch64_LDPSpre:
		case AArch64_STPSpre:
			DecodeFPR32RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeFPR32RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
	}

	DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
	MCOperand_CreateImm0(Inst, offset);

	// You shouldn't load to the same register twice in an instruction...
	if (IsLoad && Rt == Rt2)
		return SoftFail;

	// ... or do any operation that writes-back to a transfer register. But note
	// that "stp xzr, xzr, [sp], #4" is fine because xzr and sp are different.
	if (NeedsDisjointWritebackTransfer && Rn != 31 && (Rt == Rn || Rt2 == Rn))
		return SoftFail;

	return Success;
}